

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void clearkeys(global_State *g,GCObject *l,GCObject *f)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  Node *limit;
  Node *n;
  Table *h;
  GCObject *f_local;
  GCObject *l_local;
  global_State *g_local;
  
  for (f_local = l; f_local != f; f_local = f_local[3].next) {
    lVar2 = *(long *)&f_local[1].tt;
    bVar1 = f_local->field_0xb;
    for (limit = *(Node **)&f_local[1].tt;
        limit < (Node *)(lVar2 + (long)(1 << (bVar1 & 0x1f)) * 0x20); limit = limit + 1) {
      if ((limit->i_val).tt_ != 0) {
        iVar3 = iscleared(g,&(limit->i_key).tvk);
        if (iVar3 != 0) {
          (limit->i_val).tt_ = 0;
          removeentry(limit);
        }
      }
    }
  }
  return;
}

Assistant:

static void clearkeys(global_State *g, GCObject *l, GCObject *f) {
    for (; l != f; l = gco2t(l)->gclist) {
        Table *h = gco2t(l);
        Node *n, *limit = gnodelast(h);
        for (n = gnode(h, 0); n < limit; n++) {
            if (!ttisnil(gval(n)) && (iscleared(g, gkey(n)))) {
                setnilvalue(gval(n));  /* remove value ... */
                removeentry(n);  /* and remove entry from table */
            }
        }
    }
}